

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

void __thiscall level_tools::paint_debug_cform(level_tools *this,xr_surface *surface,uint16_t flags)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  char *gamemtl;
  uint16_t flags_local;
  xr_surface *surface_local;
  level_tools *this_local;
  
  xray_re::xr_surface::gamemtl_abi_cxx11_(surface);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = xray_re::xr_ini_file::line_exist(this->m_ini,"debug_cform_textures",pcVar2);
  if (bVar1) {
    pcVar2 = xray_re::xr_ini_file::r_string(this->m_ini,"debug_cform_textures",pcVar2);
    psVar3 = xray_re::xr_surface::texture_abi_cxx11_(surface);
    std::__cxx11::string::operator=((string *)psVar3,pcVar2);
  }
  else {
    xray_re::msg("can\'t assign texture for game material %s",pcVar2);
  }
  if ((flags & 1) == 0) {
    pcVar2 = this->m_ghost_eshader;
    psVar3 = xray_re::xr_surface::eshader_abi_cxx11_(surface);
    std::__cxx11::string::operator=((string *)psVar3,pcVar2);
  }
  return;
}

Assistant:

void level_tools::paint_debug_cform(xr_surface* surface, uint16_t flags) const
{
	const char* gamemtl = surface->gamemtl().c_str();
	if (m_ini->line_exist("debug_cform_textures", gamemtl))
		surface->texture() = m_ini->r_string("debug_cform_textures", gamemtl);
	else
		msg("can't assign texture for game material %s", gamemtl);
	if ((flags & RSF_COLLISION) == 0)
		surface->eshader() = m_ghost_eshader;
}